

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GED_BasicRotorWingAircraft.cpp
# Opt level: O3

void __thiscall
KDIS::DATA_TYPE::GED_BasicRotorWingAircraft::Decode
          (GED_BasicRotorWingAircraft *this,KDataStream *stream)

{
  KException *this_00;
  KUINT16 KVar1;
  KString local_40;
  
  KVar1 = KDataStream::GetBufferSize(stream);
  if (0x17 < KVar1) {
    GED_BasicFixedWingAircraft::Decode(&this->super_GED_BasicFixedWingAircraft,stream);
    KDataStream::Read(stream,&this->m_i8TrrtAz);
    KDataStream::Read(stream,&this->m_i8GnElv);
    KDataStream::Read(stream,&this->m_i8TrrtSlwRt);
    KDataStream::Read(stream,&this->m_i8GnElvRt);
    return;
  }
  this_00 = (KException *)__cxa_allocate_exception(0x30);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"Decode","");
  KException::KException(this_00,&local_40,2);
  __cxa_throw(this_00,&KException::typeinfo,KException::~KException);
}

Assistant:

void GED_BasicRotorWingAircraft::Decode(KDataStream &stream) noexcept(false)
{
    if( stream.GetBufferSize() < GED_BASIC_ROTOR_WING_AIRCRAFT_SIZE )throw KException( __FUNCTION__, NOT_ENOUGH_DATA_IN_BUFFER );

    GED_BasicFixedWingAircraft::Decode( stream );

    stream >> m_i8TrrtAz
           >> m_i8GnElv
           >> m_i8TrrtSlwRt
           >> m_i8GnElvRt;
}